

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O3

void Abc_NtkExpandCubes(Abc_Ntk_t *pNtk,Gia_Man_t *pGia,int fVerbose)

{
  char cVar1;
  uint uVar2;
  size_t __size;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  Vec_Str_t *vSop;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  Gia_Man_t *pGVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  ulong uVar11;
  uint local_4c;
  long local_48;
  Gia_Man_t *local_40;
  Abc_Ntk_t *local_38;
  
  vSop = (Vec_Str_t *)malloc(0x10);
  vSop->nCap = 1000;
  vSop->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  vSop->pArray = pcVar5;
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8c,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  if (pNtk->vCis->nSize != pGia->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8d,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  pVVar9 = pNtk->vCos;
  if (pVVar9->nSize != pGia->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8e,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  local_4c = 0;
  pGVar8 = pGia;
  pAVar3 = pNtk;
  if (0 < pVVar9->nSize) {
    do {
      local_38 = pAVar3;
      local_40 = pGVar8;
      if ((int)local_4c < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar10 = *(long *)(*(long *)(*(long *)(*pVVar9->pArray[local_4c] + 0x20) + 8) +
                        (long)**(int **)((long)pVVar9->pArray[local_4c] + 0x20) * 8);
      if (((*(uint *)(lVar10 + 0x14) & 0xf) == 7) && (*(int *)(lVar10 + 0x1c) != 0)) {
        if (*(int *)(lVar10 + 0x1c) != pGia->vCis->nSize) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                        ,0x94,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        vSop->nSize = 0;
        pcVar5 = *(char **)(lVar10 + 0x38);
        local_48 = lVar10;
        sVar6 = strlen(pcVar5);
        if ((int)(uint)sVar6 < 1) {
          if (vSop->nCap != 0) goto LAB_00591d9e;
LAB_00591da9:
          lVar10 = local_48;
          if (vSop->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vSop->pArray,0x10);
          }
          vSop->pArray = pcVar5;
          vSop->nCap = 0x10;
        }
        else {
          uVar11 = 0;
          do {
            cVar1 = pcVar5[uVar11];
            uVar2 = vSop->nSize;
            if (uVar2 == vSop->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vSop->pArray == (char *)0x0) {
                  pcVar7 = (char *)malloc(0x10);
                }
                else {
                  pcVar7 = (char *)realloc(vSop->pArray,0x10);
                }
                vSop->pArray = pcVar7;
                vSop->nCap = 0x10;
              }
              else {
                __size = (ulong)uVar2 * 2;
                if (vSop->pArray == (char *)0x0) {
                  pcVar7 = (char *)malloc(__size);
                }
                else {
                  pcVar7 = (char *)realloc(vSop->pArray,__size);
                }
                vSop->pArray = pcVar7;
                vSop->nCap = (int)__size;
              }
            }
            else {
              pcVar7 = vSop->pArray;
            }
            pNtk = local_38;
            pGia = local_40;
            lVar10 = local_48;
            iVar4 = vSop->nSize;
            vSop->nSize = iVar4 + 1;
            pcVar7[iVar4] = cVar1;
            uVar11 = uVar11 + 1;
          } while (((uint)sVar6 & 0x7fffffff) != uVar11);
          uVar2 = vSop->nSize;
          if (uVar2 == vSop->nCap) {
            if ((int)uVar2 < 0x10) goto LAB_00591da9;
            sVar6 = (ulong)uVar2 * 2;
            if (vSop->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar6);
            }
            else {
              pcVar5 = (char *)realloc(vSop->pArray,sVar6);
            }
            vSop->pArray = pcVar5;
            vSop->nCap = (int)sVar6;
          }
          else {
LAB_00591d9e:
            pcVar5 = vSop->pArray;
            lVar10 = local_48;
          }
        }
        iVar4 = vSop->nSize;
        vSop->nSize = iVar4 + 1;
        pcVar5[iVar4] = '\0';
        pGVar8 = Gia_ManDupCones(pGia,(int *)&local_4c,1,0);
        if (pGVar8->vCis->nSize != pGia->vCis->nSize) {
          __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                        ,0x9b,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        iVar4 = Abc_ObjExpandCubes(vSop,pGVar8,*(int *)(lVar10 + 0x1c));
        if (iVar4 != 0) {
          *(undefined4 *)(lVar10 + 0x1c) = 0;
        }
        Gia_ManStop(pGVar8);
        pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,vSop->pArray);
        *(char **)(lVar10 + 0x38) = pcVar5;
        pVVar9 = pNtk->vCos;
      }
      local_4c = local_4c + 1;
      pGVar8 = local_40;
      pAVar3 = local_38;
    } while ((int)local_4c < pVVar9->nSize);
    pcVar5 = vSop->pArray;
  }
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(vSop);
  Abc_NtkSortSops(pNtk);
  return;
}

Assistant:

void Abc_NtkExpandCubes( Abc_Ntk_t * pNtk, Gia_Man_t * pGia, int fVerbose )
{
    Gia_Man_t * pNew;
    Abc_Obj_t * pObj; int i;
    Vec_Str_t * vSop = Vec_StrAlloc( 1000 );
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia) );
    assert( Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_ObjFanin0(pObj);
        if ( !Abc_ObjIsNode(pObj) || Abc_ObjFaninNum(pObj) == 0 )
            continue;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia) );

        Vec_StrClear( vSop );
        Vec_StrAppend( vSop, (char *)pObj->pData );
        Vec_StrPush( vSop, '\0' );

        pNew = Gia_ManDupCones( pGia, &i, 1, 0 );
        assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia) );
        if ( Abc_ObjExpandCubes( vSop, pNew, Abc_ObjFaninNum(pObj) ) )
            Vec_IntClear( &pObj->vFanins );
        Gia_ManStop( pNew );

        pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Vec_StrArray(vSop) );
    }
    Vec_StrFree( vSop );
    Abc_NtkSortSops( pNtk );
}